

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O0

TVMArgValue __thiscall tvm::runtime::TVMArgs::operator[](TVMArgs *this,int i)

{
  bool bVar1;
  ostringstream *poVar2;
  ostream *poVar3;
  TVMArgValue TVar4;
  LogMessageFatal local_1b8;
  LogCheckError local_30;
  LogCheckError _check_err;
  int i_local;
  TVMArgs *this_local;
  undefined4 local_10;
  
  _check_err.str._4_4_ = i;
  dmlc::LogCheck_LT((dmlc *)&local_30,i,this->num_args);
  bVar1 = dmlc::LogCheckError::operator_cast_to_bool(&local_30);
  if (bVar1) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_1b8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/include/tvm/runtime/packed_func.h"
               ,0x408);
    poVar2 = dmlc::LogMessageFatal::stream_abi_cxx11_(&local_1b8);
    poVar3 = std::operator<<((ostream *)poVar2,"Check failed: ");
    poVar3 = std::operator<<(poVar3,"i < num_args");
    poVar3 = std::operator<<(poVar3,(string *)local_30.str);
    poVar3 = std::operator<<(poVar3,": ");
    poVar3 = std::operator<<(poVar3,"not enough argument passed, ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->num_args);
    poVar3 = std::operator<<(poVar3," passed");
    poVar3 = std::operator<<(poVar3," but request arg[");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,_check_err.str._4_4_);
    std::operator<<(poVar3,"].");
    dmlc::LogMessageFatal::~LogMessageFatal(&local_1b8);
  }
  dmlc::LogCheckError::~LogCheckError(&local_30);
  TVMArgValue::TVMArgValue
            ((TVMArgValue *)&this_local,this->values[_check_err.str._4_4_],
             this->type_codes[_check_err.str._4_4_]);
  TVar4.super_TVMPODValue_._12_4_ = 0;
  TVar4.super_TVMPODValue_.value_ = (TVMValue_conflict)this_local;
  TVar4.super_TVMPODValue_.type_code_ = local_10;
  return (TVMArgValue)TVar4.super_TVMPODValue_;
}

Assistant:

inline TVMArgValue TVMArgs::operator[](int i) const {
  CHECK_LT(i, num_args)
      << "not enough argument passed, "
      << num_args << " passed"
      << " but request arg[" << i << "].";
  return TVMArgValue(values[i], type_codes[i]);
}